

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O1

void __thiscall LoaderInstance::~LoaderInstance(LoaderInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrGeneratedDispatchTableCore *pXVar3;
  char *pcVar4;
  long lVar5;
  string out;
  ostringstream oss;
  string local_1e8;
  undefined1 local_1c8 [32];
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  this->_vptr_LoaderInstance = (_func_int **)&PTR__LoaderInstance_001509d8;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Destroying LoaderInstance = ",0x1c);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  local_1c8._0_8_ = this;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x12');
  *local_1e8._M_dataplus._M_p = '0';
  local_1e8._M_dataplus._M_p[1] = 'x';
  pcVar4 = local_1e8._M_dataplus._M_p + (local_1e8._M_string_length - 1);
  lVar5 = 0;
  do {
    bVar2 = local_1c8[lVar5];
    *pcVar4 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar4[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar5 = lVar5 + 1;
    pcVar4 = pcVar4 + -2;
  } while (lVar5 != 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"xrDestroyInstance","");
  std::__cxx11::stringbuf::str();
  local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoaderLogger::LogInfoMessage(&local_1e8,(string *)local_1c8,&local_1a8);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_1a8);
  if ((LoaderInstance *)local_1c8._0_8_ != (LoaderInstance *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  pXVar3 = (this->_dispatch_table)._M_t.
           super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
           ._M_t.
           super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
           .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl;
  if (pXVar3 != (XrGeneratedDispatchTableCore *)0x0) {
    operator_delete(pXVar3,0x1f8);
  }
  (this->_dispatch_table)._M_t.
  super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  ._M_t.
  super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
  .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl =
       (XrGeneratedDispatchTableCore *)0x0;
  std::
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ::~vector(&this->_api_layer_interfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_enabled_extensions);
  return;
}

Assistant:

LoaderInstance::~LoaderInstance() {
    std::ostringstream oss;
    oss << "Destroying LoaderInstance = ";
    oss << PointerToHexString(this);
    LoaderLogger::LogInfoMessage("xrDestroyInstance", oss.str());
}